

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

void density_tests::detail::
     PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>>
     ::
     put_impl<density::sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>::reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>>::Data>>
               (reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
                *i_transaction,EasyRandom *i_rand)

{
  undefined1 auVar1 [16];
  int32_t iVar2;
  Data *this;
  value_type local_40;
  char *chars;
  ulong uStack_30;
  char fill_char;
  size_t size;
  size_t index;
  size_t count;
  EasyRandom *i_rand_local;
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
  *i_transaction_local;
  
  count = (size_t)i_rand;
  i_rand_local = (EasyRandom *)i_transaction;
  index = EasyRandom::get_int<unsigned_long>(i_rand,0,200);
  for (size = 0; size < index; size = size + 1) {
    uStack_30 = index - size;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uStack_30;
    chars._7_1_ = SUB161(auVar1 % ZEXT816(10),0) + 0x30;
    local_40 = (value_type)
               density::
               sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
               ::
               reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
               ::raw_allocate((reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
                               *)i_rand_local,uStack_30 + 1,1);
    memset(local_40,(uint)chars._7_1_,uStack_30);
    local_40[uStack_30] = '\0';
    this = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::
           reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
           ::
           element<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data,_nullptr>
                     ((reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
                       *)i_rand_local);
    std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->m_blocks,&local_40);
    iVar2 = EasyRandom::get_bool((EasyRandom *)count,0.05);
    if (iVar2 != 0) {
      exception_checkpoint();
    }
  }
  exception_checkpoint();
  return;
}

Assistant:

static void put_impl(PUT_TRANSACTION & i_transaction, EasyRandom & i_rand)
            {
                size_t count = i_rand.get_int<size_t>(0, 200);
                for (size_t index = 0; index < count; index++)
                {
                    auto const size      = count - index;
                    auto const fill_char = static_cast<char>('0' + size % 10);
                    auto const chars = static_cast<char *>(i_transaction.raw_allocate(size + 1, 1));
                    memset(chars, fill_char, size);
                    chars[size] = 0;
                    i_transaction.element().m_blocks.push_back(chars);

                    if (i_rand.get_bool(.05))
                    {
                        exception_checkpoint();
                    }
                }
                exception_checkpoint();
            }